

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

bool __thiscall
httplib::ClientImpl::write_request
          (ClientImpl *this,Stream *strm,Request *req,bool close_connection,Error *error)

{
  Headers *this_00;
  _Rb_tree_header *p_Var1;
  char *pcVar2;
  pointer pcVar3;
  size_type sVar4;
  undefined8 uVar5;
  char cVar6;
  bool bVar7;
  int iVar8;
  const_iterator cVar9;
  int extraout_var;
  int extraout_var_00;
  compressor *compressor;
  int iVar10;
  undefined7 in_register_00000009;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_1;
  char cVar11;
  ulong uVar12;
  ulong uVar13;
  string length;
  Headers headers;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  Error *local_98;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  string local_60;
  pointer local_40;
  pointer local_38;
  
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98 = error;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((int)CONCAT71(in_register_00000009,close_connection) != 0) {
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<char_const(&)[11],char_const(&)[6]>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&local_90,(char (*) [11])"Connection",(char (*) [6])"close");
  }
  local_d8.first._M_dataplus._M_p = (pointer)&local_d8.first.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Host","");
  this_00 = &req->headers;
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,&local_d8.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.first._M_dataplus._M_p != &local_d8.first.field_2) {
    operator_delete(local_d8.first._M_dataplus._M_p,local_d8.first.field_2._M_allocated_capacity + 1
                   );
  }
  p_Var1 = &(req->headers)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar9._M_node == p_Var1) {
    iVar8 = (*this->_vptr_ClientImpl[6])(this);
    iVar10 = 0x50;
    if ((char)iVar8 != '\0') {
      iVar10 = 0x1bb;
    }
    __args_1 = &this->host_and_port_;
    if (this->port_ == iVar10) {
      __args_1 = &this->host_;
    }
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<char_const(&)[5],std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&local_90,(char (*) [5])"Host",__args_1);
  }
  local_d8.first._M_dataplus._M_p = (pointer)&local_d8.first.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Accept","");
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,&local_d8.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.first._M_dataplus._M_p != &local_d8.first.field_2) {
    operator_delete(local_d8.first._M_dataplus._M_p,local_d8.first.field_2._M_allocated_capacity + 1
                   );
  }
  if ((_Rb_tree_header *)cVar9._M_node == p_Var1) {
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<char_const(&)[7],char_const(&)[4]>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&local_90,(char (*) [7])"Accept",(char (*) [4])"*/*");
  }
  local_d8.first._M_dataplus._M_p = (pointer)&local_d8.first.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"User-Agent","");
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,&local_d8.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.first._M_dataplus._M_p != &local_d8.first.field_2) {
    operator_delete(local_d8.first._M_dataplus._M_p,local_d8.first.field_2._M_allocated_capacity + 1
                   );
  }
  if ((_Rb_tree_header *)cVar9._M_node == p_Var1) {
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<char_const(&)[11],char_const(&)[16]>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&local_90,(char (*) [11])"User-Agent",(char (*) [16])"cpp-httplib/0.7");
  }
  if ((req->body)._M_string_length == 0) {
    if ((req->content_provider_).super__Function_base._M_manager == (_Manager_type)0x0) {
      iVar8 = std::__cxx11::string::compare((char *)req);
      if (((iVar8 == 0) || (iVar8 = std::__cxx11::string::compare((char *)req), iVar8 == 0)) ||
         (iVar8 = std::__cxx11::string::compare((char *)req), iVar8 == 0)) {
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_equal<char_const(&)[15],char_const(&)[2]>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&local_90,(char (*) [15])"Content-Length",(char (*) [2])0x12edb3);
      }
    }
    else if (req->is_chunked_content_provider_ == false) {
      uVar12 = req->content_length_;
      cVar11 = '\x01';
      if (9 < uVar12) {
        uVar13 = uVar12;
        cVar6 = '\x04';
        do {
          cVar11 = cVar6;
          if (uVar13 < 100) {
            cVar11 = cVar11 + -2;
            goto LAB_00110f38;
          }
          if (uVar13 < 1000) {
            cVar11 = cVar11 + -1;
            goto LAB_00110f38;
          }
          if (uVar13 < 10000) goto LAB_00110f38;
          bVar7 = 99999 < uVar13;
          uVar13 = uVar13 / 10000;
          cVar6 = cVar11 + '\x04';
        } while (bVar7);
        cVar11 = cVar11 + '\x01';
      }
LAB_00110f38:
      local_d8.first._M_dataplus._M_p = (pointer)&local_d8.first.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_d8,cVar11);
      std::__detail::__to_chars_10_impl<unsigned_long>
                (local_d8.first._M_dataplus._M_p,(uint)local_d8.first._M_string_length,uVar12);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_equal<char_const(&)[15],std::__cxx11::string&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)&local_90,(char (*) [15])"Content-Length",&local_d8.first);
      goto LAB_00110f72;
    }
  }
  else {
    local_d8.first._M_dataplus._M_p = (pointer)&local_d8.first.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Content-Type","");
    cVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&this_00->_M_t,&local_d8.first);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.first._M_dataplus._M_p != &local_d8.first.field_2) {
      operator_delete(local_d8.first._M_dataplus._M_p,
                      local_d8.first.field_2._M_allocated_capacity + 1);
    }
    if ((_Rb_tree_header *)cVar9._M_node == p_Var1) {
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_equal<char_const(&)[13],char_const(&)[11]>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)&local_90,(char (*) [13])"Content-Type",(char (*) [11])"text/plain");
    }
    local_d8.first._M_dataplus._M_p = (pointer)&local_d8.first.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Content-Length","");
    cVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&this_00->_M_t,&local_d8.first);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.first._M_dataplus._M_p != &local_d8.first.field_2) {
      operator_delete(local_d8.first._M_dataplus._M_p,
                      local_d8.first.field_2._M_allocated_capacity + 1);
    }
    if ((_Rb_tree_header *)cVar9._M_node == p_Var1) {
      uVar12 = (req->body)._M_string_length;
      cVar11 = '\x01';
      if (9 < uVar12) {
        uVar13 = uVar12;
        cVar6 = '\x04';
        do {
          cVar11 = cVar6;
          if (uVar13 < 100) {
            cVar11 = cVar11 + -2;
            goto LAB_00110ef5;
          }
          if (uVar13 < 1000) {
            cVar11 = cVar11 + -1;
            goto LAB_00110ef5;
          }
          if (uVar13 < 10000) goto LAB_00110ef5;
          bVar7 = 99999 < uVar13;
          uVar13 = uVar13 / 10000;
          cVar6 = cVar11 + '\x04';
        } while (bVar7);
        cVar11 = cVar11 + '\x01';
      }
LAB_00110ef5:
      local_d8.first._M_dataplus._M_p = (pointer)&local_d8.first.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_d8,cVar11);
      std::__detail::__to_chars_10_impl<unsigned_long>
                (local_d8.first._M_dataplus._M_p,(uint)local_d8.first._M_string_length,uVar12);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_equal<char_const(&)[15],std::__cxx11::string&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)&local_90,(char (*) [15])"Content-Length",&local_d8.first);
LAB_00110f72:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8.first._M_dataplus._M_p != &local_d8.first.field_2) {
        operator_delete(local_d8.first._M_dataplus._M_p,
                        local_d8.first.field_2._M_allocated_capacity + 1);
      }
    }
  }
  if ((this->basic_auth_password_)._M_string_length != 0) {
    make_basic_authentication_header
              (&local_d8,&this->basic_auth_username_,&this->basic_auth_password_,false);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&local_90,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.second._M_dataplus._M_p != &local_d8.second.field_2) {
      operator_delete(local_d8.second._M_dataplus._M_p,
                      local_d8.second.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.first._M_dataplus._M_p != &local_d8.first.field_2) {
      operator_delete(local_d8.first._M_dataplus._M_p,
                      local_d8.first.field_2._M_allocated_capacity + 1);
    }
  }
  if (((this->proxy_basic_auth_username_)._M_string_length != 0) &&
     ((this->proxy_basic_auth_password_)._M_string_length != 0)) {
    make_basic_authentication_header
              (&local_d8,&this->proxy_basic_auth_username_,&this->proxy_basic_auth_password_,true);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&local_90,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.second._M_dataplus._M_p != &local_d8.second.field_2) {
      operator_delete(local_d8.second._M_dataplus._M_p,
                      local_d8.second.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.first._M_dataplus._M_p != &local_d8.first.field_2) {
      operator_delete(local_d8.first._M_dataplus._M_p,
                      local_d8.first.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->bearer_token_auth_token_)._M_string_length != 0) {
    make_bearer_token_authentication_header(&local_d8,&this->bearer_token_auth_token_,false);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&local_90,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.second._M_dataplus._M_p != &local_d8.second.field_2) {
      operator_delete(local_d8.second._M_dataplus._M_p,
                      local_d8.second.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.first._M_dataplus._M_p != &local_d8.first.field_2) {
      operator_delete(local_d8.first._M_dataplus._M_p,
                      local_d8.first.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->proxy_bearer_token_auth_token_)._M_string_length != 0) {
    make_bearer_token_authentication_header(&local_d8,&this->proxy_bearer_token_auth_token_,true);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&local_90,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.second._M_dataplus._M_p != &local_d8.second.field_2) {
      operator_delete(local_d8.second._M_dataplus._M_p,
                      local_d8.second.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.first._M_dataplus._M_p != &local_d8.first.field_2) {
      operator_delete(local_d8.first._M_dataplus._M_p,
                      local_d8.first.field_2._M_allocated_capacity + 1);
    }
  }
  pcVar2 = local_d8.first.field_2._M_local_buf + 8;
  local_d8.first._M_dataplus._M_p = (pointer)&PTR__BufferStream_00142770;
  local_d8.first.field_2._M_allocated_capacity = 0;
  local_d8.first.field_2._M_local_buf[8] = '\0';
  local_d8.second._M_string_length = 0;
  local_d8.first._M_string_length = (size_type)pcVar2;
  detail::encode_url(&local_60,&req->path);
  local_38 = (req->method)._M_dataplus._M_p;
  local_40 = local_60._M_dataplus._M_p;
  Stream::write_format<char_const*,char_const*>
            ((Stream *)&local_d8,"%s %s HTTP/1.1\r\n",&local_38,&local_40);
  detail::write_headers<httplib::Request>((Stream *)&local_d8,req,(Headers *)&local_90);
  uVar5 = local_d8.first.field_2._M_allocated_capacity;
  sVar4 = local_d8.first._M_string_length;
  uVar12 = 0;
  do {
    if ((ulong)uVar5 <= uVar12) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      local_d8.first._M_dataplus._M_p = (pointer)&PTR__BufferStream_00142770;
      if ((char *)local_d8.first._M_string_length != pcVar2) {
        operator_delete((void *)local_d8.first._M_string_length,
                        CONCAT71(local_d8.first.field_2._9_7_,local_d8.first.field_2._M_local_buf[8]
                                ) + 1);
      }
      uVar12 = (req->body)._M_string_length;
      if (uVar12 != 0) {
        pcVar3 = (req->body)._M_dataplus._M_p;
        uVar13 = 0;
        goto LAB_0011126f;
      }
      if (req->is_chunked_content_provider_ == true) {
        compressor = (compressor *)operator_new(8);
        compressor->_vptr_compressor = (_func_int **)&PTR__compressor_001428e0;
        bVar7 = detail::
                write_content_chunked<httplib::ClientImpl::write_content_with_provider(httplib::Stream&,httplib::Request_const&,httplib::Error&)::_lambda()_1_,httplib::detail::compressor>
                          (strm,&req->content_provider_,(anon_class_1_0_00000001 *)&local_d8,
                           compressor,local_98);
        (*compressor->_vptr_compressor[1])(compressor);
      }
      else {
        bVar7 = detail::
                write_content<httplib::ClientImpl::write_content_with_provider(httplib::Stream&,httplib::Request_const&,httplib::Error&)::_lambda()_1_>
                          (strm,&req->content_provider_,0,req->content_length_,local_98);
      }
      goto LAB_00111305;
    }
    iVar8 = (*strm->_vptr_Stream[5])(strm,(char *)(sVar4 + uVar12));
    uVar12 = uVar12 + CONCAT44(extraout_var,iVar8);
  } while (-1 < extraout_var);
  *local_98 = Write;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  local_d8.first._M_dataplus._M_p = (pointer)&PTR__BufferStream_00142770;
  if ((char *)local_d8.first._M_string_length != pcVar2) {
    operator_delete((void *)local_d8.first._M_string_length,
                    CONCAT71(local_d8.first.field_2._9_7_,local_d8.first.field_2._M_local_buf[8]) +
                    1);
  }
  bVar7 = false;
LAB_00111305:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_90);
  return bVar7;
  while( true ) {
    iVar8 = (*strm->_vptr_Stream[5])(strm,pcVar3 + uVar13);
    uVar13 = uVar13 + CONCAT44(extraout_var_00,iVar8);
    if (extraout_var_00 < 0) break;
LAB_0011126f:
    bVar7 = uVar12 <= uVar13;
    if (uVar12 <= uVar13) break;
  }
  goto LAB_00111305;
}

Assistant:

inline bool ClientImpl::write_request(Stream &strm, const Request &req,
										  bool close_connection, Error &error) {
		// Prepare additional headers
		Headers headers;
		if (close_connection) { headers.emplace("Connection", "close"); }

		if (!req.has_header("Host")) {
			if (is_ssl()) {
				if (port_ == 443) {
					headers.emplace("Host", host_);
				} else {
					headers.emplace("Host", host_and_port_);
				}
			} else {
				if (port_ == 80) {
					headers.emplace("Host", host_);
				} else {
					headers.emplace("Host", host_and_port_);
				}
			}
		}

		if (!req.has_header("Accept")) { headers.emplace("Accept", "*/*"); }

		if (!req.has_header("User-Agent")) {
			headers.emplace("User-Agent", "cpp-httplib/0.7");
		}

		if (req.body.empty()) {
			if (req.content_provider_) {
				if (!req.is_chunked_content_provider_) {
					auto length = std::to_string(req.content_length_);
					headers.emplace("Content-Length", length);
				}
			} else {
				if (req.method == "POST" || req.method == "PUT" ||
					req.method == "PATCH") {
					headers.emplace("Content-Length", "0");
				}
			}
		} else {
			if (!req.has_header("Content-Type")) {
				headers.emplace("Content-Type", "text/plain");
			}

			if (!req.has_header("Content-Length")) {
				auto length = std::to_string(req.body.size());
				headers.emplace("Content-Length", length);
			}
		}

		if (!basic_auth_password_.empty()) {
			headers.insert(make_basic_authentication_header(
					basic_auth_username_, basic_auth_password_, false));
		}

		if (!proxy_basic_auth_username_.empty() &&
			!proxy_basic_auth_password_.empty()) {
			headers.insert(make_basic_authentication_header(
					proxy_basic_auth_username_, proxy_basic_auth_password_, true));
		}

		if (!bearer_token_auth_token_.empty()) {
			headers.insert(make_bearer_token_authentication_header(
					bearer_token_auth_token_, false));
		}

		if (!proxy_bearer_token_auth_token_.empty()) {
			headers.insert(make_bearer_token_authentication_header(
					proxy_bearer_token_auth_token_, true));
		}

		// Request line and headers
		{
			detail::BufferStream bstrm;

			const auto &path = detail::encode_url(req.path);
			bstrm.write_format("%s %s HTTP/1.1\r\n", req.method.c_str(), path.c_str());

			detail::write_headers(bstrm, req, headers);

			// Flush buffer
			auto &data = bstrm.get_buffer();
			if (!detail::write_data(strm, data.data(), data.size())) {
				error = Error::Write;
				return false;
			}
		}

		// Body
		if (req.body.empty()) {
			return write_content_with_provider(strm, req, error);
		} else {
			return detail::write_data(strm, req.body.data(), req.body.size());
		}

		return true;
	}